

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

void __thiscall FArchive::WriteString(FArchive *this,char *str)

{
  size_t sVar1;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    WriteCount(this,(int)sVar1 + 1);
    (*this->_vptr_FArchive[2])(this,str,sVar1 & 0xffffffff);
    return;
  }
  WriteCount(this,0);
  return;
}

Assistant:

void FArchive::WriteString (const char *str)
{
	if (str == NULL)
	{
		WriteCount (0);
	}
	else
	{
		DWORD size = (DWORD)(strlen (str) + 1);
		WriteCount (size);
		Write (str, size - 1);
	}
}